

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void csvStats(ostream *out,list<runData,_std::allocator<runData>_> *data,bool outputSizeData,
             int timing)

{
  double dVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  long lVar5;
  char *pcVar6;
  _List_node_base *p_Var7;
  string compName;
  runData run;
  char *local_178;
  long local_170;
  char local_168;
  undefined7 uStack_167;
  int local_154;
  string local_150;
  _List_node_base *local_130;
  _List_node_base *local_128;
  undefined8 uStack_120;
  vector<partStats,_std::allocator<partStats>_> local_118;
  partStats local_100;
  _List_node_base *local_40;
  _List_node_base *p_Stack_38;
  
  local_130 = (_List_node_base *)data;
  std::__ostream_insert<char,std::char_traits<char>>(out,"file name",9);
  local_154 = (int)CONCAT71(in_register_00000011,outputSizeData);
  if (local_154 == 0) {
    pcVar6 = ",compression,pixel mode";
    lVar5 = 0x17;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,",input size,pixel count,channel count,tile count,raw size",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(out,",compression,pixel mode",0x17);
    pcVar6 = ",output size";
    lVar5 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
  if ((timing & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,",count read time",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(out,",read time",10);
  }
  if ((timing & 2U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,",write time",0xb);
  }
  if ((timing & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,",count reread time",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(out,",reread time",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  p_Var7 = (((_List_base<runData,_std::allocator<runData>_> *)&local_130->_M_next)->_M_impl)._M_node
           .super__List_node_base._M_next;
  if (p_Var7 != local_130) {
    do {
      local_128 = p_Var7[1]._M_next;
      uStack_120 = p_Var7[1]._M_prev;
      std::vector<partStats,_std::allocator<partStats>_>::vector
                (&local_118,(vector<partStats,_std::allocator<partStats>_> *)(p_Var7 + 2));
      partStats::partStats(&local_100,(partStats *)&p_Var7[3]._M_prev);
      p_Var2 = local_128;
      local_40 = p_Var7[0xf]._M_prev;
      p_Stack_38 = p_Var7[0x10]._M_next;
      if (local_128 == (_List_node_base *)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      else {
        sVar3 = strlen((char *)local_128);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)p_Var2,sVar3);
      }
      if ((char)local_154 != '\0') {
        local_178._0_1_ = (string)0x2c;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_178,1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_178._0_1_ = (string)0x2c;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_178,1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_178._0_1_ = (string)0x2c;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_178,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if (local_100.sizeData.isTiled == true) {
          local_178._0_1_ = (string)0x2c;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_178,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,",---",4);
        }
        local_178 = (char *)CONCAT71(local_178._1_7_,0x2c);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_178,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      local_178 = &local_168;
      local_170 = 0;
      local_168 = '\0';
      if (uStack_120._4_4_ == NUM_COMPRESSION_METHODS) {
        std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,0x110bd4);
      }
      else {
        Imf_3_4::getCompressionNameFromId(uStack_120._4_4_,(string *)&local_178);
      }
      local_150._M_dataplus._M_p._0_1_ = 0x2c;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_178,local_170);
      local_150._M_dataplus._M_p._0_1_ = 0x2c;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_150,1);
      modeName_abi_cxx11_(&local_150,(PixelMode)uStack_120);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)CONCAT71(local_150._M_dataplus._M_p._1_7_,
                                         local_150._M_dataplus._M_p._0_1_),
                 local_150._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_150._M_dataplus._M_p._1_7_,local_150._M_dataplus._M_p._0_1_) !=
          &local_150.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_150._M_dataplus._M_p._1_7_,local_150._M_dataplus._M_p._0_1_),
                        local_150.field_2._M_allocated_capacity + 1);
      }
      if ((char)local_154 != '\0') {
        local_150._M_dataplus._M_p._0_1_ = 0x2c;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      if ((timing & 1U) != 0) {
        if (local_100.sizeData.isDeep == true) {
          local_150._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
          dVar1 = median(&local_100.countReadPerf);
          std::ostream::_M_insert<double>(dVar1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,",---",4);
        }
        local_150._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
        dVar1 = median(&local_100.readPerf);
        std::ostream::_M_insert<double>(dVar1);
      }
      if ((timing & 2U) != 0) {
        local_150._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
        dVar1 = median(&local_100.writePerf);
        std::ostream::_M_insert<double>(dVar1);
      }
      if ((timing & 4U) != 0) {
        if (local_100.sizeData.isDeep == true) {
          local_150._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
          dVar1 = median(&local_100.countRereadPerf);
          std::ostream::_M_insert<double>(dVar1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,",---",4);
        }
        local_150._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_150,1);
        dVar1 = median(&local_100.rereadPerf);
        std::ostream::_M_insert<double>(dVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      if (local_178 != &local_168) {
        operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.sizeData.partType._M_dataplus._M_p != &local_100.sizeData.partType.field_2) {
        operator_delete(local_100.sizeData.partType._M_dataplus._M_p,
                        local_100.sizeData.partType.field_2._M_allocated_capacity + 1);
      }
      if (local_100.rereadPerf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.rereadPerf.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.rereadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.rereadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_100.countRereadPerf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.countRereadPerf.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.countRereadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.countRereadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_100.writePerf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.writePerf.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.writePerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.writePerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_100.readPerf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.readPerf.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.readPerf.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.readPerf.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_100.countReadPerf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.countReadPerf.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.countReadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.countReadPerf.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::vector<partStats,_std::allocator<partStats>_>::~vector(&local_118);
      p_Var7 = (((_List_base<runData,_std::allocator<runData>_> *)&p_Var7->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var7 != local_130);
  }
  return;
}

Assistant:

void
csvStats (ostream& out, list<runData>& data, bool outputSizeData, int timing)
{
    out << "file name";
    if (outputSizeData)
    {
        out << ",input size,pixel count,channel count,tile count,raw size";
    }
    out << ",compression,pixel mode";
    if (outputSizeData) { out << ",output size"; }
    if (timing & options::TIME_READ)
    {
        out << ",count read time";
        out << ",read time";
    }
    if (timing & options::TIME_WRITE) { out << ",write time"; }
    if (timing & options::TIME_REREAD)
    {
        out << ",count reread time";
        out << ",reread time";
    }
    cout << "\n";
    for (runData run: data)
    {
        out << run.file;
        if (outputSizeData)
        {
            out << ',' << run.metrics.inputFileSize << ','
                << run.metrics.totalStats.sizeData.pixelCount << ','
                << run.metrics.totalStats.sizeData.channelCount;
            if (run.metrics.totalStats.sizeData.isTiled)
            {
                out << ',' << run.metrics.totalStats.sizeData.tileCount;
            }
            else { out << ",---"; }
            out << ',' << run.metrics.totalStats.sizeData.rawSize;
        }
        string compName;
        if (run.compression == NUM_COMPRESSION_METHODS)
        {
            compName = "original";
        }
        else { getCompressionNameFromId (run.compression, compName); }
        out << ',' << compName << ',' << modeName (run.mode);

        if (outputSizeData) { out << ',' << run.metrics.outputFileSize; }
        if (timing & options::TIME_READ)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countReadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.readPerf);
        }
        if (timing & options::TIME_WRITE)
        {
            out << ',' << median (run.metrics.totalStats.writePerf);
        }
        if (timing & options::TIME_REREAD)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countRereadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.rereadPerf);
        }
        out << "\n";
    }
}